

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2cell_id_vector.cc
# Opt level: O2

vector<S2CellId,_std::allocator<S2CellId>_> * __thiscall
s2coding::EncodedS2CellIdVector::Decode
          (vector<S2CellId,_std::allocator<S2CellId>_> *__return_storage_ptr__,
          EncodedS2CellIdVector *this)

{
  S2CellId SVar1;
  int i;
  ulong uVar2;
  allocator_type local_19;
  
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
            (__return_storage_ptr__,(ulong)(this->deltas_).size_,&local_19);
  for (uVar2 = 0; uVar2 < (this->deltas_).size_; uVar2 = uVar2 + 1) {
    SVar1 = operator[](this,(int)uVar2);
    (__return_storage_ptr__->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar2].id_ = SVar1.id_;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<S2CellId> EncodedS2CellIdVector::Decode() const {
  vector<S2CellId> result(size());
  for (int i = 0; i < size(); ++i) {
    result[i] = (*this)[i];
  }
  return result;
}